

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O3

bool __thiscall Board::operator==(Board *this,Board *board)

{
  uint uVar1;
  pointer pvVar2;
  long lVar3;
  long lVar4;
  size_t __n;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar6 = (ulong)board->row;
  if (0 < (long)uVar6) {
    uVar1 = board->column;
    pvVar2 = (this->matrix).
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar9 = true;
    uVar8 = 0;
    do {
      if (0 < (int)uVar1) {
        lVar3 = *(long *)&pvVar2[uVar8].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        lVar4 = *(long *)&(board->matrix).
                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar8].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        lVar7 = 0;
        do {
          __n = *(size_t *)(lVar3 + 8 + lVar7);
          if (__n == *(size_t *)(lVar4 + 8 + lVar7)) {
            if (__n == 0) {
              return bVar9;
            }
            iVar5 = bcmp(*(void **)(lVar3 + lVar7),*(void **)(lVar4 + lVar7),__n);
            if (iVar5 == 0) {
              return bVar9;
            }
          }
          lVar7 = lVar7 + 0x20;
        } while ((ulong)uVar1 << 5 != lVar7);
      }
      uVar8 = uVar8 + 1;
      bVar9 = uVar8 < uVar6;
    } while (uVar8 != uVar6);
  }
  return false;
}

Assistant:

bool operator==( Board board )
        {
            for( int i = 0; i < board.row; i++ )
            {
                for( int j = 0; j < board.column; j++ )
                {
                    if( this->matrix[i][j] == board.matrix[i][j] )
                    {
                        return true;
                    }
                }
            }

            return false;
        }